

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O0

void __thiscall
cereal::PortableBinaryInputArchive::loadBinary<1ul>
          (PortableBinaryInputArchive *this,void *data,size_t size)

{
  char *pcVar1;
  ulong uVar2;
  string *what_;
  ulong in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  uint8_t *ptr;
  size_t readSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  
  pcVar1 = (char *)std::ios::rdbuf();
  uVar2 = std::streambuf::sgetn(pcVar1,in_RSI);
  if (uVar2 == in_RDX) {
    if (in_RDI[7].field_2._M_local_buf[8] != '\0') {
      for (uVar2 = 0; uVar2 < in_RDX; uVar2 = uVar2 + 1) {
        portable_binary_detail::swap_bytes<1ul>((uint8_t *)in_RDI);
      }
    }
    return;
  }
  what_ = (string *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
  std::operator+((char *)in_stack_ffffffffffffff18,in_RDI);
  std::operator+(in_stack_ffffffffffffff18,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Exception::Exception((Exception *)in_RDI,what_);
  __cxa_throw(what_,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline
      void loadBinary( void * const data, std::size_t size )
      {
        // load data
        auto const readSize = static_cast<std::size_t>( itsStream.rdbuf()->sgetn( reinterpret_cast<char*>( data ), size ) );

        if(readSize != size)
          throw Exception("Failed to read " + std::to_string(size) + " bytes from input stream! Read " + std::to_string(readSize));

        // flip bits if needed
        if( itsConvertEndianness )
        {
          std::uint8_t * ptr = reinterpret_cast<std::uint8_t*>( data );
          for( std::size_t i = 0; i < size; i += DataSize )
            portable_binary_detail::swap_bytes<DataSize>( ptr + i );
        }
      }